

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint isGrayICCProfile(uchar *profile,uint size)

{
  bool local_15;
  uint size_local;
  uchar *profile_local;
  uint local_4;
  
  if (size < 0x14) {
    local_4 = 0;
  }
  else {
    local_15 = false;
    if (((profile[0x10] == 'G') && (local_15 = false, profile[0x11] == 'R')) &&
       (local_15 = false, profile[0x12] == 'A')) {
      local_15 = profile[0x13] == 'Y';
    }
    local_4 = (uint)local_15;
  }
  return local_4;
}

Assistant:

static unsigned isGrayICCProfile(const unsigned char* profile, unsigned size) {
  /*
  It is a gray profile if bytes 16-19 are "GRAY", rgb profile if bytes 16-19
  are "RGB ". We do not perform any full parsing of the ICC profile here, other
  than check those 4 bytes to grayscale profile. Other than that, validity of
  the profile is not checked. This is needed only because the PNG specification
  requires using a non-gray color model if there is an ICC profile with "RGB "
  (sadly limiting compression opportunities if the input data is grayscale RGB
  data), and requires using a gray color model if it is "GRAY".
  */
  if (size < 20) return 0;
  return profile[16] == 'G' && profile[17] == 'R' && profile[18] == 'A' && profile[19] == 'Y';
}